

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

SparseArraySegmentBase * __thiscall
Js::JavascriptArray::GetBeginLookupSegment(JavascriptArray *this,uint32 index,bool useSegmentMap)

{
  SparseArraySegmentBase **ppSVar1;
  JavascriptArray *local_60;
  JavascriptArray *local_58;
  JavascriptArray *local_48;
  SparseArraySegmentBase *matchOrNextSeg;
  SparseArraySegmentBase *nextSeg;
  SegmentBTreeRoot *segmentMap;
  SparseArraySegmentBase *lastUsedSeg;
  SparseArraySegmentBase *seg;
  bool useSegmentMap_local;
  JavascriptArray *pJStack_18;
  uint32 index_local;
  JavascriptArray *this_local;
  
  lastUsedSeg = (SparseArraySegmentBase *)0x0;
  seg._3_1_ = useSegmentMap;
  seg._4_4_ = index;
  pJStack_18 = this;
  segmentMap = (SegmentBTreeRoot *)GetLastUsedSegment(this);
  if ((((JavascriptArray *)segmentMap == (JavascriptArray *)0x0) ||
      (seg._4_4_ <
       *(uint *)&(((JavascriptArray *)segmentMap)->super_ArrayObject).super_DynamicObject.
                 super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject)) ||
     (lastUsedSeg = (SparseArraySegmentBase *)segmentMap, this_local = (JavascriptArray *)segmentMap
     , *(uint *)&(((JavascriptArray *)segmentMap)->super_ArrayObject).super_DynamicObject.
                 super_RecyclableObject.type.ptr <=
       seg._4_4_ -
       *(Type *)&(((JavascriptArray *)segmentMap)->super_ArrayObject).super_DynamicObject.
                 super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject)) {
    nextSeg = (SparseArraySegmentBase *)GetSegmentMap(this);
    if (((seg._3_1_ & 1) == 0) || ((SegmentBTreeRoot *)nextSeg == (SegmentBTreeRoot *)0x0)) {
      if (lastUsedSeg == (SparseArraySegmentBase *)0x0) {
        ppSVar1 = Memory::PointerValue<Js::SparseArraySegmentBase>(&this->head);
        local_58 = (JavascriptArray *)*ppSVar1;
      }
      else {
        local_58 = (JavascriptArray *)lastUsedSeg;
      }
      this_local = local_58;
    }
    else {
      if (lastUsedSeg != (SparseArraySegmentBase *)0x0) {
        ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                            ((WriteBarrierPtr *)&lastUsedSeg->next);
        matchOrNextSeg = *ppSVar1;
        if ((JavascriptArray *)matchOrNextSeg != (JavascriptArray *)0x0) {
          if (seg._4_4_ <
              *(uint *)&(((JavascriptArray *)matchOrNextSeg)->super_ArrayObject).super_DynamicObject
                        .super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject
                        ._vptr_IRecyclerVisitedObject) {
            return lastUsedSeg;
          }
          if (seg._4_4_ -
              *(Type *)&(((JavascriptArray *)matchOrNextSeg)->super_ArrayObject).super_DynamicObject
                        .super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject
                        ._vptr_IRecyclerVisitedObject <
              *(uint *)&(((JavascriptArray *)matchOrNextSeg)->super_ArrayObject).super_DynamicObject
                        .super_RecyclableObject.type.ptr) {
            return matchOrNextSeg;
          }
        }
      }
      SegmentBTreeRoot::Find
                ((SegmentBTreeRoot *)nextSeg,seg._4_4_,&lastUsedSeg,
                 (SparseArraySegmentBase **)&local_48);
      if (lastUsedSeg == (SparseArraySegmentBase *)0x0) {
        local_60 = local_48;
      }
      else {
        local_60 = (JavascriptArray *)lastUsedSeg;
      }
      this_local = local_60;
    }
  }
  return (SparseArraySegmentBase *)this_local;
}

Assistant:

SparseArraySegmentBase * JavascriptArray::GetBeginLookupSegment(uint32 index, const bool useSegmentMap) const
    {
        SparseArraySegmentBase *seg = nullptr;
        SparseArraySegmentBase * lastUsedSeg = this->GetLastUsedSegment();
        if (lastUsedSeg != nullptr && lastUsedSeg->left <= index)
        {
            seg = lastUsedSeg;
            if(index - lastUsedSeg->left < lastUsedSeg->size)
            {
                return seg;
            }
        }

        SegmentBTreeRoot * segmentMap = GetSegmentMap();
        if(!useSegmentMap || !segmentMap)
        {
            return seg ? seg : PointerValue(this->head);
        }

        if(seg)
        {
            // If indexes are being accessed sequentially, check the segment after the last-used segment before checking the
            // segment map, as it is likely to hit
            SparseArraySegmentBase *const nextSeg = seg->next;
            if(nextSeg)
            {
                if(index < nextSeg->left)
                {
                    return seg;
                }
                else if(index - nextSeg->left < nextSeg->size)
                {
                    return nextSeg;
                }
            }
        }

        SparseArraySegmentBase *matchOrNextSeg;
        segmentMap->Find(index, seg, matchOrNextSeg);
        return seg ? seg : matchOrNextSeg;
    }